

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

void ZSTD_fillDoubleHashTable
               (ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm,
               ZSTD_tableFillPurpose_e tfp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  U32 *hashTable;
  U32 *pUVar4;
  BYTE *pBVar5;
  char cVar6;
  BYTE *pBVar7;
  ulong uVar8;
  long lVar9;
  size_t hashAndTag;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  U32 *hashLarge;
  int local_80;
  int local_50;
  
  hashTable = ms->hashTable;
  uVar1 = (ms->cParams).hashLog;
  if (tfp == ZSTD_tfp_forCDict) {
    uVar2 = (ms->cParams).minMatch;
    pUVar4 = ms->chainTable;
    uVar3 = (ms->cParams).chainLog;
    pBVar5 = (ms->window).base;
    uVar11 = (ulong)ms->nextToUpdate;
    cVar6 = (char)uVar3;
    pBVar7 = pBVar5 + uVar11;
    while (pBVar7 + 2 <= (BYTE *)((long)end - 8U)) {
      local_50 = (int)pBVar5;
      lVar12 = 0;
      uVar8 = uVar11;
      do {
        if (lVar12 == 3) break;
        if (0x20 < uVar3 + 8) {
LAB_001b0d54:
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        switch(uVar2) {
        case 5:
          lVar9 = -0x30e4432345000000;
          break;
        case 6:
          lVar9 = -0x30e4432340650000;
          break;
        case 7:
          lVar9 = -0x30e44323405a9d00;
          break;
        case 8:
          uVar13 = *(long *)(pBVar7 + lVar12) * -0x30e44323485a9b9d;
          goto LAB_001b0b4d;
        default:
          hashAndTag = (size_t)((uint)(*(int *)(pBVar7 + lVar12) * -0x61c8864f) >>
                               (0x18U - cVar6 & 0x1f));
          goto LAB_001b0b55;
        }
        uVar13 = lVar9 * *(long *)(pBVar7 + lVar12);
LAB_001b0b4d:
        hashAndTag = uVar13 >> (0x38U - cVar6 & 0x3f);
LAB_001b0b55:
        if (0x20 < uVar1 + 8) goto LAB_001b0d54;
        uVar13 = (ulong)(*(long *)(pBVar7 + lVar12) * -0x30e44323485a9b9d) >>
                 (0x38U - (char)uVar1 & 0x3f);
        if (lVar12 == 0) {
          ZSTD_writeTaggedIndex(pUVar4,hashAndTag,(int)pBVar7 - local_50);
LAB_001b0b9d:
          ZSTD_writeTaggedIndex(hashTable,uVar13,(U32)uVar8);
        }
        else if (hashTable[uVar13 >> 8] == 0) goto LAB_001b0b9d;
        lVar12 = lVar12 + 1;
        uVar8 = (ulong)((U32)uVar8 + 1);
      } while (dtlm != ZSTD_dtlm_fast);
      uVar11 = (ulong)((int)uVar11 + 3);
      pBVar7 = pBVar7 + 3;
    }
  }
  else {
    uVar2 = (ms->cParams).minMatch;
    pUVar4 = ms->chainTable;
    uVar3 = (ms->cParams).chainLog;
    pBVar5 = (ms->window).base;
    uVar11 = (ulong)ms->nextToUpdate;
    cVar6 = (char)uVar3;
    pBVar7 = pBVar5 + uVar11;
    while (pBVar7 + 2 <= (BYTE *)((long)end - 8U)) {
      local_80 = (int)pBVar5;
      lVar12 = 0;
      uVar8 = uVar11;
      do {
        if (lVar12 == 3) break;
        if (0x20 < uVar3) goto LAB_001b0d54;
        switch(uVar2) {
        case 5:
          lVar9 = -0x30e4432345000000;
          break;
        case 6:
          lVar9 = -0x30e4432340650000;
          break;
        case 7:
          lVar9 = -0x30e44323405a9d00;
          break;
        case 8:
          uVar13 = *(long *)(pBVar7 + lVar12) * -0x30e44323485a9b9d;
          goto LAB_001b0cd4;
        default:
          uVar13 = (ulong)((uint)(*(int *)(pBVar7 + lVar12) * -0x61c8864f) >> (0x20U - cVar6 & 0x1f)
                          );
          goto LAB_001b0cd9;
        }
        uVar13 = lVar9 * *(long *)(pBVar7 + lVar12);
LAB_001b0cd4:
        uVar13 = uVar13 >> (0x40U - cVar6 & 0x3f);
LAB_001b0cd9:
        if (0x20 < uVar1) goto LAB_001b0d54;
        uVar10 = (ulong)(*(long *)(pBVar7 + lVar12) * -0x30e44323485a9b9d) >>
                 (0x40U - (char)uVar1 & 0x3f);
        if (lVar12 == 0) {
          pUVar4[uVar13] = (int)pBVar7 - local_80;
LAB_001b0d08:
          hashTable[uVar10] = (U32)uVar8;
        }
        else if (hashTable[uVar10] == 0) goto LAB_001b0d08;
        lVar12 = lVar12 + 1;
        uVar8 = (ulong)((U32)uVar8 + 1);
      } while (dtlm != ZSTD_dtlm_fast);
      uVar11 = (ulong)((int)uVar11 + 3);
      pBVar7 = pBVar7 + 3;
    }
  }
  return;
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                        const void* const end,
                        ZSTD_dictTableLoadMethod_e dtlm,
                        ZSTD_tableFillPurpose_e tfp)
{
    if (tfp == ZSTD_tfp_forCDict) {
        ZSTD_fillDoubleHashTableForCDict(ms, end, dtlm);
    } else {
        ZSTD_fillDoubleHashTableForCCtx(ms, end, dtlm);
    }
}